

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O3

bool testing::internal::
     TypeParameterizedTest<HashtableAllTest,_testing::internal::TemplateSel<HashtableAllTest_DeletedKey_Test>,_testing::internal::Types<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>_>
     ::Register(char *prefix,CodeLocation *code_location,char *case_name,char *test_names,int index,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *type_names)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  char *pcVar3;
  long *plVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *type_names_00;
  _Alloc_hider type_param;
  bool bVar5;
  int iVar6;
  long *plVar7;
  char *pcVar8;
  SetUpTearDownSuiteFuncType set_up_tc;
  SetUpTearDownSuiteFuncType tear_down_tc;
  TestFactoryBase *factory;
  long *plVar9;
  type_info *extraout_RDX;
  type_info *extraout_RDX_00;
  type_info *extraout_RDX_01;
  type_info *extraout_RDX_02;
  type_info *type;
  ulong uVar10;
  char *pcVar11;
  char *pcVar12;
  allocator local_189;
  char *local_188;
  long local_180;
  char local_178 [8];
  undefined8 uStack_170;
  int local_164;
  char *local_160;
  char *local_158;
  long *local_150;
  long local_148;
  long local_140;
  long lStack_138;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_130;
  long *local_128;
  char *local_120;
  char *local_118;
  long local_110;
  char local_108 [8];
  undefined8 uStack_100;
  long *local_f8;
  long local_f0;
  long local_e8;
  long lStack_e0;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  string local_98;
  CodeLocation local_78;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_160 = test_names;
  local_158 = case_name;
  std::__cxx11::string::string((string *)local_50,prefix,&local_189);
  local_120 = prefix;
  plVar7 = (long *)std::__cxx11::string::append((char *)local_50);
  local_f8 = &local_e8;
  plVar9 = plVar7 + 2;
  if ((long *)*plVar7 == plVar9) {
    local_e8 = *plVar9;
    lStack_e0 = plVar7[3];
  }
  else {
    local_e8 = *plVar9;
    local_f8 = (long *)*plVar7;
  }
  local_f0 = plVar7[1];
  *plVar7 = (long)plVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_f8);
  local_d8 = &local_c8;
  plVar9 = plVar7 + 2;
  if ((long *)*plVar7 == plVar9) {
    local_c8 = *plVar9;
    lStack_c0 = plVar7[3];
  }
  else {
    local_c8 = *plVar9;
    local_d8 = (long *)*plVar7;
  }
  local_d0 = plVar7[1];
  *plVar7 = (long)plVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_d8);
  local_b8 = &local_a8;
  plVar9 = plVar7 + 2;
  if ((long *)*plVar7 == plVar9) {
    local_a8 = *plVar9;
    lStack_a0 = plVar7[3];
  }
  else {
    local_a8 = *plVar9;
    local_b8 = (long *)*plVar7;
  }
  local_b0 = plVar7[1];
  *plVar7 = (long)plVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_b8,
                              (ulong)(type_names->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start[index]._M_dataplus.
                                     _M_p);
  pcVar12 = local_160;
  local_150 = &local_140;
  plVar9 = plVar7 + 2;
  if ((long *)*plVar7 == plVar9) {
    local_140 = *plVar9;
    lStack_138 = plVar7[3];
  }
  else {
    local_140 = *plVar9;
    local_150 = (long *)*plVar7;
  }
  plVar4 = local_150;
  local_148 = plVar7[1];
  *plVar7 = (long)plVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  pcVar8 = strchr(local_160,0x2c);
  local_164 = index;
  if (pcVar8 == (char *)0x0) {
    std::__cxx11::string::string((string *)&local_188,pcVar12,(allocator *)&local_98);
    type = extraout_RDX_00;
  }
  else {
    local_188 = local_178;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,pcVar12,pcVar8);
    type = extraout_RDX;
  }
  local_128 = plVar4;
  pcVar12 = local_188;
  local_130 = type_names;
  if (local_180 != 0) {
    pcVar8 = local_188 + local_180;
    do {
      pcVar3 = local_188;
      iVar6 = isspace((uint)(byte)pcVar8[-1]);
      type = extraout_RDX_01;
      pcVar12 = pcVar3;
      if (iVar6 == 0) break;
      pcVar11 = pcVar8 + -1;
      uVar10 = (long)pcVar11 - (long)pcVar3;
      std::__cxx11::string::_M_erase((ulong)&local_188,uVar10);
      pcVar8 = local_188 + uVar10;
      type = extraout_RDX_02;
      pcVar12 = local_188;
    } while (pcVar11 != pcVar3);
  }
  local_188 = local_178;
  if (pcVar12 == local_188) {
    uStack_100 = uStack_170;
    pcVar12 = local_108;
  }
  local_110 = local_180;
  local_180 = 0;
  local_178[0] = '\0';
  local_118 = pcVar12;
  GetTypeName_abi_cxx11_
            (&local_98,
             (internal *)
             &google::
              HashtableInterface_DenseHashMap<std::pair<int,int>,int,kEmptyIntPair,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
              ::typeinfo,type);
  type_param._M_p = local_98._M_dataplus._M_p;
  paVar1 = &local_78.file.field_2;
  pcVar2 = (code_location->file)._M_dataplus._M_p;
  local_78.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar2,pcVar2 + (code_location->file)._M_string_length);
  local_78.line = code_location->line;
  set_up_tc = SuiteApiResolver<HashtableAllTest_DeletedKey_Test<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>_>
              ::GetSetUpCaseOrSuite((code_location->file)._M_dataplus._M_p,local_78.line);
  tear_down_tc = SuiteApiResolver<HashtableAllTest_DeletedKey_Test<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>_>
                 ::GetTearDownCaseOrSuite
                           ((code_location->file)._M_dataplus._M_p,code_location->line);
  factory = (TestFactoryBase *)operator_new(8);
  factory->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_00c2fb20;
  MakeAndRegisterTestInfo
            ((char *)local_128,pcVar12,type_param._M_p,(char *)0x0,&local_78,
             &TypeIdHelper<HashtableAllTest<google::HashtableInterface_DenseHashMap<std::pair<int,int>,int,kEmptyIntPair,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>>>
              ::dummy_,set_up_tc,tear_down_tc,factory);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_78.file._M_dataplus._M_p);
  }
  iVar6 = local_164;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if (local_118 != local_108) {
    operator_delete(local_118);
  }
  if (local_188 != local_178) {
    operator_delete(local_188);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8);
  }
  type_names_00 = local_130;
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  bVar5 = TypeParameterizedTest<HashtableAllTest,_testing::internal::TemplateSel<HashtableAllTest_DeletedKey_Test>,_testing::internal::Types<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>_>
          ::Register(local_120,code_location,local_158,local_160,iVar6 + 1,type_names_00);
  return bVar5;
}

Assistant:

static bool Register(const char* prefix, const CodeLocation& code_location,
                       const char* case_name, const char* test_names, int index,
                       const std::vector<std::string>& type_names =
                           GenerateNames<DefaultNameGenerator, Types>()) {
    typedef typename Types::Head Type;
    typedef Fixture<Type> FixtureClass;
    typedef typename GTEST_BIND_(TestSel, Type) TestClass;

    // First, registers the first type-parameterized test in the type
    // list.
    MakeAndRegisterTestInfo(
        (std::string(prefix) + (prefix[0] == '\0' ? "" : "/") + case_name +
         "/" + type_names[static_cast<size_t>(index)])
            .c_str(),
        StripTrailingSpaces(GetPrefixUntilComma(test_names)).c_str(),
        GetTypeName<Type>().c_str(),
        nullptr,  // No value parameter.
        code_location, GetTypeId<FixtureClass>(),
        SuiteApiResolver<TestClass>::GetSetUpCaseOrSuite(
            code_location.file.c_str(), code_location.line),
        SuiteApiResolver<TestClass>::GetTearDownCaseOrSuite(
            code_location.file.c_str(), code_location.line),
        new TestFactoryImpl<TestClass>);

    // Next, recurses (at compile time) with the tail of the type list.
    return TypeParameterizedTest<Fixture, TestSel,
                                 typename Types::Tail>::Register(prefix,
                                                                 code_location,
                                                                 case_name,
                                                                 test_names,
                                                                 index + 1,
                                                                 type_names);
  }